

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O3

HighsInt Highs_getBasis(void *highs,HighsInt *col_status,HighsInt *row_status)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar1 = *(long *)((long)highs + 0xa0);
  lVar2 = *(long *)((long)highs + 0xa8) - lVar1;
  if (lVar2 != 0) {
    lVar3 = 0;
    do {
      col_status[lVar3] = (uint)*(byte *)(lVar1 + lVar3);
      lVar3 = lVar3 + 1;
    } while (lVar2 + (ulong)(lVar2 == 0) != lVar3);
  }
  lVar1 = *(long *)((long)highs + 0xb8);
  lVar2 = *(long *)((long)highs + 0xc0) - lVar1;
  if (lVar2 != 0) {
    lVar3 = 0;
    do {
      row_status[lVar3] = (uint)*(byte *)(lVar1 + lVar3);
      lVar3 = lVar3 + 1;
    } while (lVar2 + (ulong)(lVar2 == 0) != lVar3);
  }
  return 0;
}

Assistant:

HighsInt Highs_getBasis(const void* highs, HighsInt* col_status,
                        HighsInt* row_status) {
  const HighsBasis& basis = ((Highs*)highs)->getBasis();
  for (size_t i = 0; i < basis.col_status.size(); i++) {
    col_status[i] = static_cast<HighsInt>(basis.col_status[i]);
  }

  for (size_t i = 0; i < basis.row_status.size(); i++) {
    row_status[i] = static_cast<HighsInt>(basis.row_status[i]);
  }
  return kHighsStatusOk;
}